

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O3

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,float minRate,float maxRate)

{
  float *pfVar1;
  vector<float,_std::allocator<float>_> *this;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  iterator __position;
  void *pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  ulong uVar8;
  pointer pvVar9;
  int iVar10;
  size_type sVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  vector<float,_std::allocator<float>_> maxValues;
  vector<float,_std::allocator<float>_> minValues;
  value_type_conflict1 local_90;
  allocator_type local_89;
  size_type local_88;
  float local_80;
  float local_7c;
  size_type local_78;
  float local_70;
  float local_6c;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_38;
  
  pvVar6 = (samples->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar6 != (samples->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_80 = minRate;
    local_7c = inputSimulationTime;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_50,
               (long)(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_68,
               (allocator_type *)&local_90);
    pvVar6 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_90 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_68,
               (long)*(pointer *)
                      ((long)&(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&(pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data >> 2,&local_90,&local_89);
    pvVar6 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pfVar2 = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (pvVar6->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_88 = (long)pfVar3 - (long)pfVar2 >> 2;
    if (pfVar3 != pfVar2) {
      lVar12 = 0;
      do {
        fVar17 = pfVar2[lVar12];
        local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] = fVar17;
        *(float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + lVar12 * 4) = fVar17;
        lVar12 = lVar12 + 1;
      } while (local_88 + (local_88 == 0) != lVar12);
    }
    pvVar7 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    sVar11 = ((long)pvVar7 - (long)pvVar6 >> 3) * -0x5555555555555555;
    if (pvVar7 != pvVar6) {
      lVar12 = 0;
      do {
        if (pfVar3 != pfVar2) {
          pfVar4 = pvVar6[lVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar13 = 0;
          do {
            fVar17 = pfVar4[lVar13];
            if (fVar17 < local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13]) {
              local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = fVar17;
              fVar17 = pfVar4[lVar13];
            }
            pfVar1 = (float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_68.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar13 * 4
                              );
            if (*pfVar1 <= fVar17 && fVar17 != *pfVar1) {
              *(float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_,
                                  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._0_4_) + lVar13 * 4) = fVar17;
            }
            lVar13 = lVar13 + 1;
          } while (local_88 + (local_88 == 0) != lVar13);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != sVar11 + (sVar11 == 0));
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(spikeTrains,sVar11);
    pvVar6 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar7 != pvVar6) {
      lVar12 = 0;
      uVar15 = 0;
      do {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)(*(long *)spikeTrains + lVar12),local_88);
        uVar15 = uVar15 + 1;
        pvVar6 = (samples->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar7 = (samples->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar8 = ((long)pvVar7 - (long)pvVar6 >> 3) * -0x5555555555555555;
        lVar12 = lVar12 + 0x18;
      } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
    }
    local_38 = samples;
    if (pfVar3 != pfVar2) {
      local_88 = local_88 + (local_88 == 0);
      fVar17 = maxRate - local_80;
      local_78 = 0;
      pvVar9 = pvVar7;
      do {
        sVar11 = local_78;
        bVar16 = pvVar9 != pvVar6;
        pvVar9 = pvVar6;
        if (bVar16) {
          local_70 = *(float *)(CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_68.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_) +
                               local_78 * 4) -
                     local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[local_78];
          uVar15 = 0;
          do {
            fVar18 = (((pvVar6[uVar15].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[local_78] -
                       local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[local_78]) / local_70) * fVar17 + local_80)
                     * local_7c;
            iVar10 = (int)fVar18;
            if (0 < iVar10) {
              local_6c = local_7c / (float)(int)fVar18;
              iVar14 = 0;
              do {
                this = (vector<float,_std::allocator<float>_> *)
                       (*(long *)(*(long *)spikeTrains + uVar15 * 0x18) + sVar11 * 0x18);
                local_90 = (float)iVar14 * local_6c;
                __position._M_current =
                     (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (this,__position,&local_90);
                }
                else {
                  *__position._M_current = local_90;
                  (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                iVar14 = iVar14 + 1;
              } while (iVar10 != iVar14);
              pvVar6 = (local_38->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pvVar7 = (local_38->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar15 = uVar15 + 1;
            uVar8 = ((long)pvVar7 - (long)pvVar6 >> 3) * -0x5555555555555555;
            pvVar9 = pvVar7;
          } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
        }
        local_78 = local_78 + 1;
      } while (local_78 != local_88);
    }
    pvVar5 = (void *)CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5)
      ;
    }
    if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        float minRate, float maxRate )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            int numSpikes = static_cast<int>(inputSimulationTime * ( intensity * ( maxRate - minRate ) + minRate ));
            float spikeStep = inputSimulationTime / numSpikes;
            for ( int tdx = 0; tdx < numSpikes; ++tdx ) {
                spikeTrains[sid][activationId].emplace_back( tdx * spikeStep );
            }
        }
    }
}